

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader_halfedge.h
# Opt level: O2

GLfloat * __thiscall CMU462::ObjLoaderHalfedgeMesh::getData(ObjLoaderHalfedgeMesh *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  GLfloat *pGVar9;
  long lVar10;
  HalfedgeMesh *pHVar11;
  ulong uVar12;
  long lVar13;
  _List_node_base *p_Var14;
  long lVar15;
  undefined1 auVar16 [16];
  
  pHVar11 = this->mesh;
  iVar7 = (int)(pHVar11->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
               _M_impl._M_node._M_size;
  this->nf = iVar7;
  if (this->isData == true) {
    if (this->vertices != (GLfloat *)0x0) {
      operator_delete__(this->vertices);
      iVar7 = this->nf;
      pHVar11 = this->mesh;
    }
  }
  else {
    this->isData = true;
  }
  uVar12 = 0xffffffffffffffff;
  if (-1 < iVar7) {
    uVar12 = (long)(iVar7 * 0x12) << 2;
  }
  pGVar9 = (GLfloat *)operator_new__(uVar12);
  this->vertices = pGVar9;
  p_Var14 = (_List_node_base *)&pHVar11->faces;
  lVar15 = 0;
  lVar13 = 0;
  while (p_Var14 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var14->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var14 != (_List_node_base *)&pHVar11->faces) {
    p_Var4 = *(_List_node_base **)((long)(p_Var14[9]._M_next + 1) + 8);
    lVar10 = (long)p_Var14[9]._M_next[2]._M_next;
    lVar5 = (long)p_Var4[2]._M_next;
    lVar6 = (long)(*(_List_node_base **)((long)(p_Var4 + 1) + 8))[2]._M_next;
    dVar1 = *(double *)(lVar10 + 0x20);
    dVar2 = *(double *)(lVar5 + 0x20);
    dVar3 = *(double *)(lVar6 + 0x20);
    *(ulong *)(pGVar9 + lVar13 * 0x12) =
         CONCAT44((float)*(double *)(lVar10 + 0x18),(float)*(double *)(lVar10 + 0x10));
    pGVar9[lVar13 * 0x12 + 2] = (float)dVar1;
    *(ulong *)(pGVar9 + lVar13 * 0x12 + 6) =
         CONCAT44((float)*(double *)(lVar5 + 0x18),(float)*(double *)(lVar5 + 0x10));
    pGVar9[lVar13 * 0x12 + 8] = (float)dVar2;
    *(ulong *)(pGVar9 + lVar13 * 0x12 + 0xc) =
         CONCAT44((float)*(double *)(lVar6 + 0x18),(float)*(double *)(lVar6 + 0x10));
    pGVar9[lVar13 * 0x12 + 0xe] = (float)dVar3;
    iVar7 = rand();
    iVar8 = rand();
    auVar16._0_8_ = (double)iVar7;
    auVar16._8_8_ = (double)iVar8;
    auVar16 = divpd(auVar16,_DAT_00125070);
    iVar7 = rand();
    pGVar9 = this->vertices;
    for (lVar10 = 0x14; lVar10 != 0x5c; lVar10 = lVar10 + 0x18) {
      *(ulong *)((long)pGVar9 + lVar10 + lVar15 + -8) =
           CONCAT44((float)auVar16._8_8_,(float)auVar16._0_8_);
      *(float *)((long)pGVar9 + lVar10 + lVar15) = (float)iVar7 / 2.1474836e+09;
    }
    lVar13 = lVar13 + 1;
    lVar15 = lVar15 + 0x48;
    pHVar11 = this->mesh;
  }
  return pGVar9;
}

Assistant:

GLfloat* getData() {
        // Generate new vertices.
        nf = mesh->nFaces();
        if (isData) {
            delete[] vertices;
        } else {
            isData = true;
        }
        vertices = new GLfloat[STRIDE * nf];

        size_t i = 0;
        for (auto f = mesh->facesBegin(); f != mesh->facesEnd(); f++, i++) {
            auto pos1 = f->halfedge()->vertex()->position;
            auto pos2 = f->halfedge()->next()->vertex()->position;
            auto pos3 = f->halfedge()->next()->next()->vertex()->position;

            vertices[STRIDE * i    ]  = pos1.x;
            vertices[STRIDE * i + 1]  = pos1.y;
            vertices[STRIDE * i + 2]  = pos1.z;

            vertices[STRIDE * i + NUM_ATTR    ]  = pos2.x;
            vertices[STRIDE * i + NUM_ATTR + 1]  = pos2.y;
            vertices[STRIDE * i + NUM_ATTR + 2]  = pos2.z;

            vertices[STRIDE * i + NUM_ATTR * 2    ] = pos3.x;
            vertices[STRIDE * i + NUM_ATTR * 2 + 1] = pos3.y;
            vertices[STRIDE * i + NUM_ATTR * 2 + 2] = pos3.z;

            GLfloat color1 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color2 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color3 = static_cast<double>(rand()) / RAND_MAX;
            for (size_t j = 0; j < 3; ++j) {
                vertices[STRIDE * i + NUM_ATTR * j + 3] = color1;
                vertices[STRIDE * i + NUM_ATTR * j + 4] = color2;
                vertices[STRIDE * i + NUM_ATTR * j + 5] = color3;
            }
        }

        return vertices;
    }